

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFilteringTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::Texture3DFilteringCase::~Texture3DFilteringCase
          (Texture3DFilteringCase *this)

{
  ~Texture3DFilteringCase(this);
  operator_delete(this,0x128);
  return;
}

Assistant:

Texture3DFilteringCase::~Texture3DFilteringCase (void)
{
	Texture3DFilteringCase::deinit();
}